

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_NtkDfsNets_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vNets)

{
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  void *pvVar4;
  void **ppvVar5;
  int iVar6;
  int in_EDX;
  int Fill;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if ((*(uint *)&pNet->field_0x14 & 0xf) != 6) {
    __assert_fail("Abc_ObjIsNet(pNet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x2e4,"void Abc_NtkDfsNets_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar1 = pNet->pNtk;
  iVar6 = pNet->Id;
  Vec_IntFillExtra(&pAVar1->vTravIds,iVar6 + 1,in_EDX);
  if ((-1 < (long)iVar6) && (iVar6 < (pAVar1->vTravIds).nSize)) {
    pAVar2 = pNet->pNtk;
    iVar7 = pAVar2->nTravIds;
    if ((pAVar1->vTravIds).pArray[iVar6] != iVar7) {
      iVar6 = pNet->Id;
      Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,Fill);
      if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar2->vTravIds).pArray[iVar6] = iVar7;
      plVar3 = (long *)pNet->pNtk->vObjs->pArray[*(pNet->vFanins).pArray];
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar9 = 0;
        do {
          Abc_NtkDfsNets_rec(*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)(plVar3[4] + lVar9 * 4) * 8),vNets);
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)plVar3 + 0x1c));
      }
      if (0 < *(int *)((long)plVar3 + 0x2c)) {
        uVar8 = (ulong)(uint)vNets->nCap;
        iVar6 = vNets->nSize;
        lVar9 = 0;
        do {
          pvVar4 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[6] + lVar9 * 4) * 8);
          iVar7 = (int)uVar8;
          if (iVar6 == iVar7) {
            if (iVar7 < 0x10) {
              if (vNets->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(vNets->pArray,0x80);
              }
              vNets->pArray = ppvVar5;
              vNets->nCap = 0x10;
              uVar8 = 0x10;
            }
            else {
              uVar8 = (ulong)(uint)(iVar7 * 2);
              if (vNets->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(uVar8 * 8);
              }
              else {
                ppvVar5 = (void **)realloc(vNets->pArray,uVar8 * 8);
              }
              vNets->pArray = ppvVar5;
              vNets->nCap = iVar7 * 2;
            }
          }
          else {
            ppvVar5 = vNets->pArray;
          }
          iVar7 = vNets->nSize;
          iVar6 = iVar7 + 1;
          vNets->nSize = iVar6;
          ppvVar5[iVar7] = pvVar4;
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)plVar3 + 0x2c));
      }
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Abc_NtkDfsNets_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vNets )
{
    Abc_Obj_t * pNext;
    Abc_Obj_t * pNode; int i;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return;
    Abc_NodeSetTravIdCurrent( pNet );
    pNode = Abc_ObjFanin0( pNet );
    Abc_ObjForEachFanin( pNode, pNext, i )
        Abc_NtkDfsNets_rec( pNext, vNets );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Vec_PtrPush( vNets, pNext );
}